

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

TypeT __thiscall
wasm::WATParser::anon_unknown_11::ParseTypeDefsCtx::makeTupleType
          (ParseTypeDefsCtx *this,vector<wasm::Type,_std::allocator<wasm::Type>_> *types)

{
  TypeBuilder *this_00;
  Tuple local_38;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_20;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *types_local;
  ParseTypeDefsCtx *this_local;
  
  this_00 = this->builder;
  local_20 = types;
  types_local = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)this;
  Tuple::Tuple(&local_38,types);
  this_local = (ParseTypeDefsCtx *)TypeBuilder::getTempTupleType(this_00,&local_38);
  Tuple::~Tuple(&local_38);
  return (TypeT)(uintptr_t)this_local;
}

Assistant:

TypeT makeTupleType(const std::vector<Type> types) {
    return builder.getTempTupleType(types);
  }